

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.h
# Opt level: O3

LBBox3fa * __thiscall
embree::avx512::PointsISA::vlinearBounds
          (LBBox3fa *__return_storage_ptr__,PointsISA *this,LinearSpace3fa *space,size_t primID,
          BBox1f *time_range)

{
  byte *pbVar1;
  float fVar2;
  undefined4 uVar3;
  float fVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  BufferView<embree::Vec3fx> *pBVar8;
  char *pcVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  uint uVar25;
  long lVar26;
  size_t *psVar27;
  byte unaff_BL;
  long lVar28;
  int iVar29;
  uint uVar30;
  long lVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar52;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float in_XMM15_Da;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 in_ZMM16 [64];
  undefined1 in_XMM22 [16];
  
  fVar2 = (this->super_Points).super_Geometry.fnumTimeSegments;
  fVar45 = (this->super_Points).super_Geometry.time_range.lower;
  fVar15 = (this->super_Points).super_Geometry.time_range.upper - fVar45;
  auVar47._0_4_ = (time_range->lower - fVar45) / fVar15;
  auVar47._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar32 = vdivss_avx512f(ZEXT416((uint)(time_range->upper - fVar45)),ZEXT416((uint)fVar15));
  fVar45 = fVar2 * auVar47._0_4_;
  auVar33 = vmulss_avx512f(ZEXT416((uint)fVar2),auVar32);
  auVar35 = vroundss_avx(ZEXT416((uint)fVar45),ZEXT416((uint)fVar45),9);
  auVar34 = vrndscaless_avx512f(auVar33,auVar33);
  *(undefined1 *)((long)&space[1].vx.field_0 + 1) = 0;
  pbVar1 = (byte *)((long)&__return_storage_ptr__[-1].bounds1.upper.field_0 + 8);
  *pbVar1 = *pbVar1 | unaff_BL;
  auVar37 = vminss_avx(auVar34,ZEXT416((uint)fVar2));
  iVar29 = -1;
  if (-1 < (int)auVar35._0_4_) {
    iVar29 = (int)auVar35._0_4_;
  }
  uVar25 = (int)fVar2 + 1U;
  if ((int)auVar34._0_4_ < (int)((int)fVar2 + 1U)) {
    uVar25 = (int)auVar34._0_4_;
  }
  lVar26 = (long)(int)in_XMM15_Da;
  pBVar8 = (this->super_Points).vertices.items;
  pcVar9 = pBVar8[lVar26].super_RawBufferView.ptr_ofs;
  lVar31 = pBVar8[lVar26].super_RawBufferView.stride * primID;
  aVar5 = (space->vx).field_0;
  aVar6 = (space->vy).field_0;
  aVar7 = (space->vz).field_0;
  uVar3 = *(undefined4 *)(pcVar9 + lVar31 + 8);
  auVar35._4_4_ = uVar3;
  auVar35._0_4_ = uVar3;
  auVar35._8_4_ = uVar3;
  auVar35._12_4_ = uVar3;
  auVar35 = vmulps_avx512vl((undefined1  [16])aVar7,auVar35);
  uVar3 = *(undefined4 *)(pcVar9 + lVar31 + 4);
  auVar34._4_4_ = uVar3;
  auVar34._0_4_ = uVar3;
  auVar34._8_4_ = uVar3;
  auVar34._12_4_ = uVar3;
  auVar35 = vfmadd231ps_avx512vl(auVar35,(undefined1  [16])aVar6,auVar34);
  uVar3 = *(undefined4 *)(pcVar9 + lVar31);
  auVar36._4_4_ = uVar3;
  auVar36._0_4_ = uVar3;
  auVar36._8_4_ = uVar3;
  auVar36._12_4_ = uVar3;
  auVar35 = vfmadd231ps_avx512vl(auVar35,(undefined1  [16])aVar5,auVar36);
  fVar15 = *(float *)(pcVar9 + lVar31 + 0xc);
  auVar41._4_4_ = fVar15;
  auVar41._0_4_ = fVar15;
  auVar41._8_4_ = fVar15;
  auVar41._12_4_ = fVar15;
  auVar35 = vblendps_avx(auVar35,auVar41,8);
  fVar4 = (this->super_Points).maxRadiusScale;
  fVar15 = fVar4 * fVar15;
  auVar42._4_4_ = fVar15;
  auVar42._0_4_ = fVar15;
  auVar42._8_4_ = fVar15;
  auVar42._12_4_ = fVar15;
  auVar34 = vsubps_avx(auVar35,auVar42);
  lVar31 = (long)(int)auVar37._0_4_;
  pcVar9 = pBVar8[lVar31].super_RawBufferView.ptr_ofs;
  lVar28 = pBVar8[lVar31].super_RawBufferView.stride * primID;
  uVar3 = *(undefined4 *)(pcVar9 + lVar28 + 8);
  auVar38._4_4_ = uVar3;
  auVar38._0_4_ = uVar3;
  auVar38._8_4_ = uVar3;
  auVar38._12_4_ = uVar3;
  auVar36 = vmulps_avx512vl((undefined1  [16])aVar7,auVar38);
  uVar3 = *(undefined4 *)(pcVar9 + lVar28 + 4);
  auVar40._4_4_ = uVar3;
  auVar40._0_4_ = uVar3;
  auVar40._8_4_ = uVar3;
  auVar40._12_4_ = uVar3;
  auVar36 = vfmadd231ps_avx512vl(auVar36,(undefined1  [16])aVar6,auVar40);
  auVar54._0_4_ = auVar35._0_4_ + fVar15;
  auVar54._4_4_ = auVar35._4_4_ + fVar15;
  auVar54._8_4_ = auVar35._8_4_ + fVar15;
  auVar54._12_4_ = auVar35._12_4_ + fVar15;
  uVar3 = *(undefined4 *)(pcVar9 + lVar28);
  auVar39._4_4_ = uVar3;
  auVar39._0_4_ = uVar3;
  auVar39._8_4_ = uVar3;
  auVar39._12_4_ = uVar3;
  auVar35 = vfmadd231ps_avx512vl(auVar36,(undefined1  [16])aVar5,auVar39);
  fVar15 = *(float *)(pcVar9 + lVar28 + 0xc);
  auVar43._4_4_ = fVar15;
  auVar43._0_4_ = fVar15;
  auVar43._8_4_ = fVar15;
  auVar43._12_4_ = fVar15;
  auVar35 = vblendps_avx(auVar35,auVar43,8);
  fVar15 = fVar4 * fVar15;
  auVar50._4_4_ = fVar15;
  auVar50._0_4_ = fVar15;
  auVar50._8_4_ = fVar15;
  auVar50._12_4_ = fVar15;
  auVar36 = vsubps_avx(auVar35,auVar50);
  auVar51._0_4_ = auVar35._0_4_ + fVar15;
  auVar51._4_4_ = auVar35._4_4_ + fVar15;
  auVar51._8_4_ = auVar35._8_4_ + fVar15;
  auVar51._12_4_ = auVar35._12_4_ + fVar15;
  auVar35 = in_ZMM16._0_16_;
  if (uVar25 - iVar29 == 1) {
    auVar32 = vmaxss_avx512f(ZEXT416((uint)(fVar45 - in_XMM15_Da)),auVar35);
    fVar45 = auVar32._0_4_;
    fVar2 = 1.0 - fVar45;
    auVar57._0_4_ = fVar45 * auVar36._0_4_;
    auVar57._4_4_ = fVar45 * auVar36._4_4_;
    auVar57._8_4_ = fVar45 * auVar36._8_4_;
    auVar57._12_4_ = fVar45 * auVar36._12_4_;
    auVar56._4_4_ = fVar2;
    auVar56._0_4_ = fVar2;
    auVar56._8_4_ = fVar2;
    auVar56._12_4_ = fVar2;
    aVar5 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd231ps_fma(auVar57,auVar56,auVar34);
    auVar32._0_4_ = fVar45 * auVar51._0_4_;
    auVar32._4_4_ = fVar45 * auVar51._4_4_;
    auVar32._8_4_ = fVar45 * auVar51._8_4_;
    auVar32._12_4_ = fVar45 * auVar51._12_4_;
    (__return_storage_ptr__->bounds0).lower.field_0 = aVar5;
    aVar5 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd231ps_fma(auVar32,auVar54,auVar56);
    (__return_storage_ptr__->bounds0).upper.field_0 = aVar5;
    auVar37 = vsubss_avx512f(auVar37,auVar33);
    auVar37 = vmaxss_avx512f(auVar37,auVar35);
    fVar45 = auVar37._0_4_;
    fVar2 = 1.0 - fVar45;
    auVar49._0_4_ = fVar45 * auVar34._0_4_;
    auVar49._4_4_ = fVar45 * auVar34._4_4_;
    auVar49._8_4_ = fVar45 * auVar34._8_4_;
    auVar49._12_4_ = fVar45 * auVar34._12_4_;
    auVar48._4_4_ = fVar2;
    auVar48._0_4_ = fVar2;
    auVar48._8_4_ = fVar2;
    auVar48._12_4_ = fVar2;
    aVar53 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd213ps_fma(auVar36,auVar48,auVar49);
    auVar46._0_4_ = fVar45 * auVar54._0_4_;
    auVar46._4_4_ = fVar45 * auVar54._4_4_;
    auVar46._8_4_ = fVar45 * auVar54._8_4_;
    auVar46._12_4_ = fVar45 * auVar54._12_4_;
    aVar52 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd213ps_fma(auVar51,auVar48,auVar46);
  }
  else {
    pcVar9 = pBVar8[lVar26 + 1].super_RawBufferView.ptr_ofs;
    lVar26 = pBVar8[lVar26 + 1].super_RawBufferView.stride * primID;
    uVar3 = *(undefined4 *)(pcVar9 + lVar26 + 8);
    auVar16._4_4_ = uVar3;
    auVar16._0_4_ = uVar3;
    auVar16._8_4_ = uVar3;
    auVar16._12_4_ = uVar3;
    auVar38 = vmulps_avx512vl((undefined1  [16])aVar7,auVar16);
    uVar3 = *(undefined4 *)(pcVar9 + lVar26 + 4);
    auVar17._4_4_ = uVar3;
    auVar17._0_4_ = uVar3;
    auVar17._8_4_ = uVar3;
    auVar17._12_4_ = uVar3;
    auVar38 = vfmadd231ps_avx512vl(auVar38,(undefined1  [16])aVar6,auVar17);
    uVar3 = *(undefined4 *)(pcVar9 + lVar26);
    auVar18._4_4_ = uVar3;
    auVar18._0_4_ = uVar3;
    auVar18._8_4_ = uVar3;
    auVar18._12_4_ = uVar3;
    auVar38 = vfmadd231ps_avx512vl(auVar38,(undefined1  [16])aVar5,auVar18);
    fVar15 = *(float *)(pcVar9 + lVar26 + 0xc);
    auVar58._4_4_ = fVar15;
    auVar58._0_4_ = fVar15;
    auVar58._8_4_ = fVar15;
    auVar58._12_4_ = fVar15;
    auVar38 = vblendps_avx(auVar38,auVar58,8);
    auVar59._0_4_ = fVar4 * fVar15;
    auVar59._4_4_ = fVar4 * fVar15;
    auVar59._8_4_ = fVar4 * fVar15;
    auVar59._12_4_ = fVar4 * fVar15;
    auVar39 = vsubps_avx512vl(auVar38,auVar59);
    pcVar9 = pBVar8[lVar31 + -1].super_RawBufferView.ptr_ofs;
    lVar26 = pBVar8[lVar31 + -1].super_RawBufferView.stride * primID;
    uVar3 = *(undefined4 *)(pcVar9 + lVar26 + 8);
    auVar19._4_4_ = uVar3;
    auVar19._0_4_ = uVar3;
    auVar19._8_4_ = uVar3;
    auVar19._12_4_ = uVar3;
    auVar40 = vmulps_avx512vl((undefined1  [16])aVar7,auVar19);
    uVar3 = *(undefined4 *)(pcVar9 + lVar26 + 4);
    auVar20._4_4_ = uVar3;
    auVar20._0_4_ = uVar3;
    auVar20._8_4_ = uVar3;
    auVar20._12_4_ = uVar3;
    auVar40 = vfmadd231ps_avx512vl(auVar40,(undefined1  [16])aVar6,auVar20);
    uVar3 = *(undefined4 *)(pcVar9 + lVar26);
    auVar21._4_4_ = uVar3;
    auVar21._0_4_ = uVar3;
    auVar21._8_4_ = uVar3;
    auVar21._12_4_ = uVar3;
    auVar40 = vfmadd231ps_avx512vl(auVar40,(undefined1  [16])aVar5,auVar21);
    fVar15 = *(float *)(pcVar9 + lVar26 + 0xc);
    auVar61._4_4_ = fVar15;
    auVar61._0_4_ = fVar15;
    auVar61._8_4_ = fVar15;
    auVar61._12_4_ = fVar15;
    auVar40 = vblendps_avx(auVar40,auVar61,8);
    auVar62._0_4_ = fVar4 * fVar15;
    auVar62._4_4_ = fVar4 * fVar15;
    auVar62._8_4_ = fVar4 * fVar15;
    auVar62._12_4_ = fVar4 * fVar15;
    auVar41 = vsubps_avx512vl(auVar40,auVar62);
    auVar42 = vmaxss_avx512f(ZEXT416((uint)(fVar45 - in_XMM15_Da)),auVar35);
    auVar43 = vsubss_avx512f(ZEXT416(0x3f800000),auVar42);
    auVar63._0_4_ = auVar42._0_4_;
    auVar63._4_4_ = auVar63._0_4_;
    auVar63._8_4_ = auVar63._0_4_;
    auVar63._12_4_ = auVar63._0_4_;
    auVar39 = vmulps_avx512vl(auVar63,auVar39);
    auVar71._0_4_ = auVar43._0_4_;
    auVar71._4_4_ = auVar71._0_4_;
    auVar71._8_4_ = auVar71._0_4_;
    auVar71._12_4_ = auVar71._0_4_;
    auVar44 = vfmadd213ps_avx512vl(auVar34,auVar71,auVar39);
    auVar60._0_4_ = auVar63._0_4_ * (auVar59._0_4_ + auVar38._0_4_);
    auVar60._4_4_ = auVar63._0_4_ * (auVar59._4_4_ + auVar38._4_4_);
    auVar60._8_4_ = auVar63._0_4_ * (auVar59._8_4_ + auVar38._8_4_);
    auVar60._12_4_ = auVar63._0_4_ * (auVar59._12_4_ + auVar38._12_4_);
    auVar55 = vfmadd213ps_fma(auVar54,auVar71,auVar60);
    auVar37 = vsubss_avx512f(auVar37,auVar33);
    auVar37 = vmaxss_avx512f(auVar37,auVar35);
    auVar35 = vsubss_avx512f(ZEXT416(0x3f800000),auVar37);
    auVar33._0_4_ = auVar37._0_4_;
    auVar33._4_4_ = auVar33._0_4_;
    auVar33._8_4_ = auVar33._0_4_;
    auVar33._12_4_ = auVar33._0_4_;
    auVar37 = vmulps_avx512vl(auVar33,auVar41);
    auVar64._0_4_ = auVar35._0_4_;
    auVar64._4_4_ = auVar64._0_4_;
    auVar64._8_4_ = auVar64._0_4_;
    auVar64._12_4_ = auVar64._0_4_;
    aVar53 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd213ps_fma(auVar36,auVar64,auVar37);
    auVar37._0_4_ = auVar33._0_4_ * (auVar62._0_4_ + auVar40._0_4_);
    auVar37._4_4_ = auVar33._0_4_ * (auVar62._4_4_ + auVar40._4_4_);
    auVar37._8_4_ = auVar33._0_4_ * (auVar62._8_4_ + auVar40._8_4_);
    auVar37._12_4_ = auVar33._0_4_ * (auVar62._12_4_ + auVar40._12_4_);
    aVar52 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd213ps_fma(auVar51,auVar64,auVar37);
    uVar30 = iVar29 + 1;
    if ((int)uVar30 < (int)uVar25) {
      auVar32 = vsubss_avx512f(auVar32,auVar47);
      psVar27 = &pBVar8[uVar30].super_RawBufferView.stride;
      auVar37 = auVar44;
      auVar35 = auVar55;
      do {
        auVar33 = vcvtsi2ss_avx512f(in_XMM22,uVar30);
        auVar65._0_4_ = (auVar33._0_4_ / fVar2 - auVar47._0_4_) / auVar32._0_4_;
        auVar65._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar33 = vsubss_avx512f(ZEXT416(0x3f800000),auVar65);
        auVar72._0_4_ = auVar65._0_4_ * aVar53.m128[0];
        fVar15 = aVar53.m128[1];
        auVar72._4_4_ = auVar65._0_4_ * fVar15;
        fVar11 = aVar53.m128[2];
        auVar72._8_4_ = auVar65._0_4_ * fVar11;
        fVar13 = aVar53.m128[3];
        auVar72._12_4_ = auVar65._0_4_ * fVar13;
        auVar67._0_4_ = auVar33._0_4_;
        auVar67._4_4_ = auVar67._0_4_;
        auVar67._8_4_ = auVar67._0_4_;
        auVar67._12_4_ = auVar67._0_4_;
        auVar34 = vfmadd231ps_fma(auVar72,auVar67,auVar37);
        auVar66._0_4_ = auVar65._0_4_ * aVar52.m128[0];
        fVar10 = aVar52.m128[1];
        auVar66._4_4_ = auVar65._0_4_ * fVar10;
        fVar12 = aVar52.m128[2];
        auVar66._8_4_ = auVar65._0_4_ * fVar12;
        fVar14 = aVar52.m128[3];
        auVar66._12_4_ = auVar65._0_4_ * fVar14;
        pcVar9 = ((RawBufferView *)(psVar27 + -2))->ptr_ofs;
        lVar26 = *psVar27 * primID;
        uVar3 = *(undefined4 *)(pcVar9 + lVar26 + 8);
        auVar22._4_4_ = uVar3;
        auVar22._0_4_ = uVar3;
        auVar22._8_4_ = uVar3;
        auVar22._12_4_ = uVar3;
        auVar33 = vmulps_avx512vl((undefined1  [16])aVar7,auVar22);
        uVar3 = *(undefined4 *)(pcVar9 + lVar26 + 4);
        auVar23._4_4_ = uVar3;
        auVar23._0_4_ = uVar3;
        auVar23._8_4_ = uVar3;
        auVar23._12_4_ = uVar3;
        auVar33 = vfmadd231ps_avx512vl(auVar33,(undefined1  [16])aVar6,auVar23);
        uVar3 = *(undefined4 *)(pcVar9 + lVar26);
        auVar24._4_4_ = uVar3;
        auVar24._0_4_ = uVar3;
        auVar24._8_4_ = uVar3;
        auVar24._12_4_ = uVar3;
        auVar33 = vfmadd231ps_avx512vl(auVar33,(undefined1  [16])aVar5,auVar24);
        auVar36 = vfmadd231ps_fma(auVar66,auVar35,auVar67);
        fVar45 = *(float *)(pcVar9 + lVar26 + 0xc);
        auVar68._4_4_ = fVar45;
        auVar68._0_4_ = fVar45;
        auVar68._8_4_ = fVar45;
        auVar68._12_4_ = fVar45;
        auVar33 = vblendps_avx(auVar33,auVar68,8);
        auVar69._0_4_ = fVar4 * fVar45;
        auVar69._4_4_ = fVar4 * fVar45;
        auVar69._8_4_ = fVar4 * fVar45;
        auVar69._12_4_ = fVar4 * fVar45;
        auVar38 = vsubps_avx512vl(auVar33,auVar69);
        auVar34 = vsubps_avx512vl(auVar38,auVar34);
        auVar70._0_4_ = auVar69._0_4_ + auVar33._0_4_;
        auVar70._4_4_ = auVar69._4_4_ + auVar33._4_4_;
        auVar70._8_4_ = auVar69._8_4_ + auVar33._8_4_;
        auVar70._12_4_ = auVar69._12_4_ + auVar33._12_4_;
        auVar33 = vsubps_avx(auVar70,auVar36);
        auVar34 = vminps_avx(auVar34,ZEXT416(0) << 0x20);
        auVar33 = vmaxps_avx(auVar33,ZEXT416(0) << 0x20);
        auVar44._0_4_ = auVar34._0_4_ + auVar37._0_4_;
        auVar44._4_4_ = auVar34._4_4_ + auVar37._4_4_;
        auVar44._8_4_ = auVar34._8_4_ + auVar37._8_4_;
        auVar44._12_4_ = auVar34._12_4_ + auVar37._12_4_;
        aVar53._0_4_ = auVar34._0_4_ + aVar53.m128[0];
        aVar53._4_4_ = auVar34._4_4_ + fVar15;
        aVar53._8_4_ = auVar34._8_4_ + fVar11;
        aVar53._12_4_ = auVar34._12_4_ + fVar13;
        auVar55._0_4_ = auVar33._0_4_ + auVar35._0_4_;
        auVar55._4_4_ = auVar33._4_4_ + auVar35._4_4_;
        auVar55._8_4_ = auVar33._8_4_ + auVar35._8_4_;
        auVar55._12_4_ = auVar33._12_4_ + auVar35._12_4_;
        aVar52._0_4_ = auVar33._0_4_ + aVar52.m128[0];
        aVar52._4_4_ = auVar33._4_4_ + fVar10;
        aVar52._8_4_ = auVar33._8_4_ + fVar12;
        aVar52._12_4_ = auVar33._12_4_ + fVar14;
        uVar30 = uVar30 + 1;
        psVar27 = psVar27 + 7;
        auVar37 = auVar44;
        auVar35 = auVar55;
      } while (uVar25 != uVar30);
    }
    *(undefined1 (*) [16])(__return_storage_ptr__->bounds0).lower.field_0.m128 = auVar44;
    *(undefined1 (*) [16])(__return_storage_ptr__->bounds0).upper.field_0.m128 = auVar55;
  }
  (__return_storage_ptr__->bounds1).lower.field_0 = aVar53;
  (__return_storage_ptr__->bounds1).upper.field_0 = aVar52;
  return __return_storage_ptr__;
}

Assistant:

__forceinline LBBox3fa linearBounds(const LinearSpace3fa& space, size_t primID, const BBox1f& dt) const {
      return LBBox3fa([&](size_t itime) { return bounds(space, primID, itime); }, dt, time_range, fnumTimeSegments);
    }